

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::OpcodeExpr<(wabt::ExprType)6>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)6>_>_>
 __thiscall
wabt::MakeUnique<wabt::OpcodeExpr<(wabt::ExprType)6>,wabt::Opcode&>(wabt *this,Opcode *args)

{
  Enum EVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x40);
  EVar1 = args->enum_;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  *(undefined8 *)((long)puVar2 + 0x24) = 0;
  *(undefined8 *)((long)puVar2 + 0x2c) = 0;
  *(undefined4 *)(puVar2 + 7) = 6;
  *puVar2 = &PTR__Expr_001c0a40;
  *(Enum *)((long)puVar2 + 0x3c) = EVar1;
  *(undefined8 **)this = puVar2;
  return (__uniq_ptr_data<wabt::OpcodeExpr<(wabt::ExprType)6>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)6>_>,_true,_true>
          )(__uniq_ptr_data<wabt::OpcodeExpr<(wabt::ExprType)6>,_std::default_delete<wabt::OpcodeExpr<(wabt::ExprType)6>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}